

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver_p.h
# Opt level: O3

void __thiscall QSslServerPrivate::SocketData::disconnectSignals(SocketData *this)

{
  long in_FS_OFFSET;
  Connection __old_val;
  Connection local_38;
  Connection local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::Connection::Connection(&local_38);
  local_30.d_ptr = (this->readyReadConnection).d_ptr;
  (this->readyReadConnection).d_ptr = local_38.d_ptr;
  local_38.d_ptr = (void *)0x0;
  QObject::disconnect(&local_30);
  QMetaObject::Connection::~Connection(&local_30);
  QMetaObject::Connection::~Connection(&local_38);
  QMetaObject::Connection::Connection(&local_38);
  local_30.d_ptr = (this->destroyedConnection).d_ptr;
  (this->destroyedConnection).d_ptr = local_38.d_ptr;
  local_38.d_ptr = (void *)0x0;
  QObject::disconnect(&local_30);
  QMetaObject::Connection::~Connection(&local_30);
  QMetaObject::Connection::~Connection(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void disconnectSignals()
        {
            QObject::disconnect(std::exchange(readyReadConnection, {}));
            QObject::disconnect(std::exchange(destroyedConnection, {}));
        }